

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

UDate __thiscall
icu_63::RuleBasedTimeZone::getTransitionTime
          (RuleBasedTimeZone *this,Transition *transition,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt)

{
  int32_t iVar1;
  int32_t dstBefore;
  int32_t rawAfter;
  int32_t dstAfter;
  RuleBasedTimeZone *this_00;
  double dVar2;
  
  dVar2 = transition->time;
  if (local != '\0') {
    iVar1 = TimeZoneRule::getRawOffset(transition->from);
    dstBefore = TimeZoneRule::getDSTSavings(transition->from);
    rawAfter = TimeZoneRule::getRawOffset(transition->to);
    this_00 = (RuleBasedTimeZone *)transition->to;
    dstAfter = TimeZoneRule::getDSTSavings((TimeZoneRule *)this_00);
    iVar1 = getLocalDelta(this_00,iVar1,dstBefore,rawAfter,dstAfter,NonExistingTimeOpt,
                          DuplicatedTimeOpt);
    dVar2 = dVar2 + (double)iVar1;
  }
  return dVar2;
}

Assistant:

UDate
RuleBasedTimeZone::getTransitionTime(Transition* transition, UBool local,
                                     int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt) const {
    UDate time = transition->time;
    if (local) {
        time += getLocalDelta(transition->from->getRawOffset(), transition->from->getDSTSavings(),
                              transition->to->getRawOffset(), transition->to->getDSTSavings(),
                              NonExistingTimeOpt, DuplicatedTimeOpt);
    }
    return time;
}